

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_LBackward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  char cVar1;
  complex<double> **ppcVar2;
  complex<double> *pcVar3;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  double dVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [16];
  complex<double> *pcVar12;
  complex<double> val;
  long local_90;
  long local_80;
  long local_70;
  double local_58;
  double dStack_50;
  complex<double> local_48;
  
  lVar9 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar8 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if (((lVar9 != CONCAT44(extraout_var,iVar8)) ||
      (cVar1 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed,
      cVar1 == '\x03')) || (cVar1 == '\0')) {
    TPZMatrix<std::complex<double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<double>>::Subst_LBackward(TPZFMatrix<TVar> *) const [TVar = std::complex<double>]"
               ,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
  }
  iVar8 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  local_90 = CONCAT44(extraout_var_00,iVar8);
  if (1 < local_90) {
    local_80 = local_90 * 0x10 + -0x20;
    do {
      lVar9 = local_90 + -1;
      if (0 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) {
        local_70 = 0;
        lVar10 = 0;
        do {
          ppcVar2 = (this->fElem).fStore;
          pcVar3 = ppcVar2[local_90];
          if ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow < local_90) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar4 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
          pcVar12 = B->fElem + lVar4 * lVar10 + lVar9;
          local_48._M_value._0_8_ = *(undefined8 *)pcVar12->_M_value;
          local_48._M_value._8_8_ = *(undefined8 *)(pcVar12->_M_value + 8);
          pcVar12 = ppcVar2[lVar9] + 1;
          if (pcVar12 < pcVar3) {
            pauVar11 = (undefined1 (*) [16])(B->fElem->_M_value + lVar4 * local_70 + local_80);
            do {
              local_58 = *(double *)pcVar12->_M_value;
              dStack_50 = *(double *)(pcVar12->_M_value + 8);
              std::complex<double>::operator*=((complex<double> *)&local_58,&local_48);
              dVar7 = *(double *)(*pauVar11 + 8) - dStack_50;
              auVar6._8_4_ = SUB84(dVar7,0);
              auVar6._0_8_ = *(double *)*pauVar11 - local_58;
              auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
              *pauVar11 = auVar6;
              pcVar12 = pcVar12 + 1;
              pauVar11 = pauVar11 + -1;
            } while (pcVar12 < pcVar3);
          }
          lVar10 = lVar10 + 1;
          local_70 = local_70 + 0x10;
        } while (lVar10 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
      }
      local_80 = local_80 + -0x10;
      bVar5 = 2 < local_90;
      local_90 = lVar9;
    } while (bVar5);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || !this->fDecomposed || this->fDecomposed == ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
    
    int64_t Dimension = this->Dim();
    for ( int64_t k = Dimension-1; k > 0; k-- ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            //		TVar val = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            // substract the column of the skyline matrix from the vector.
            
            TVar val = *BPtr;
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    return( 1 );
}